

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int read_Header(archive_read *a,_7z_header_info *h,int check_header_id)

{
  _7z_coders_info *val;
  uint64_t *puVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  _7z_stream_info *si;
  size_t sVar5;
  _7z_folder *p_Var6;
  ulong uVar7;
  _7z_coder *p_Var8;
  uint uVar9;
  int iVar10;
  uchar *p;
  uchar *puVar11;
  byte *pbVar12;
  ulong uVar13;
  _7z_coder *p_Var14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  size_t rbytes;
  ulong uVar18;
  bool bVar19;
  uint64_t size;
  ulong local_68;
  _7z_coders_info *local_60;
  ulong local_58;
  _7z_folder *local_50;
  uchar *local_48;
  ulong local_40;
  uchar *local_38;
  
  si = (_7z_stream_info *)a->format->data;
  if (check_header_id != 0) {
    puVar11 = header_bytes(a,1);
    if (puVar11 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar11 != '\x01') {
      return -1;
    }
  }
  pbVar12 = header_bytes(a,1);
  if (pbVar12 == (byte *)0x0) {
    return -1;
  }
  if (*pbVar12 == 2) {
    do {
      puVar11 = header_bytes(a,1);
      if (puVar11 == (uchar *)0x0) {
        uVar9 = 1;
      }
      else if (*puVar11 == '\0') {
        uVar9 = 2;
      }
      else {
        uVar9 = parse_7zip_uint64(a,&local_68);
        uVar9 = uVar9 >> 0x1f;
      }
    } while (uVar9 == 0);
    if (uVar9 != 2) {
      return -1;
    }
    pbVar12 = header_bytes(a,1);
    if (pbVar12 == (byte *)0x0) {
      return -1;
    }
  }
  if (*pbVar12 == 4) {
    iVar10 = read_StreamsInfo(a,si);
    if (iVar10 < 0) {
      return -1;
    }
    pbVar12 = header_bytes(a,1);
    if (pbVar12 == (byte *)0x0) {
      return -1;
    }
  }
  bVar2 = *pbVar12;
  if (bVar2 == 0) {
    return (uint)bVar2;
  }
  if (bVar2 != 5) {
    return -1;
  }
  val = &si[1].ci;
  iVar10 = parse_7zip_uint64(a,&val->numFolders);
  if (iVar10 < 0) {
    return -1;
  }
  if (1000000 < val->numFolders) {
    return -1;
  }
  local_50 = (_7z_folder *)calloc(val->numFolders,0x58);
  si[1].ci.folders = local_50;
  if (local_50 == (_7z_folder *)0x0) {
    return -1;
  }
  local_58 = 0;
  local_60 = val;
LAB_001f93d5:
  pbVar12 = header_bytes(a,1);
  if (pbVar12 == (byte *)0x0) {
LAB_001f9409:
    iVar10 = 1;
    goto LAB_001f9746;
  }
  bVar2 = *pbVar12;
  if (bVar2 == 0) {
    iVar10 = 4;
    goto LAB_001f9746;
  }
  iVar10 = parse_7zip_uint64(a,&local_68);
  uVar13 = local_58;
  uVar16 = local_68;
  if ((iVar10 < 0) || (si[1].pi.numPackStreams < local_68)) goto LAB_001f9409;
  switch(bVar2) {
  case 0xe:
    sVar5 = local_60->numFolders;
    puVar11 = (uchar *)calloc(sVar5,1);
    h->emptyStreamBools = puVar11;
    if (puVar11 == (uchar *)0x0) {
LAB_001f96a5:
      iVar10 = 1;
    }
    else {
      iVar17 = read_Bools(a,puVar11,sVar5);
      iVar10 = 1;
      if (-1 < iVar17) {
        if (local_60->numFolders == 0) {
          local_58 = 0;
        }
        else {
          uVar16 = 0;
          local_58 = 0;
          do {
            local_58 = (ulong)(((int)local_58 + 1) - (uint)(h->emptyStreamBools[uVar16] == '\0'));
            uVar16 = uVar16 + 1;
          } while ((uVar16 & 0xffffffff) < local_60->numFolders);
        }
        goto LAB_001f9743;
      }
    }
    break;
  case 0xf:
    if ((int)local_58 < 1) goto switchD_001f943b_default;
    puVar11 = (uchar *)calloc(local_58 & 0xffffffff,1);
    h->emptyFileBools = puVar11;
LAB_001f965d:
    if (puVar11 == (uchar *)0x0) goto LAB_001f96a5;
    iVar17 = read_Bools(a,puVar11,uVar13 & 0xffffffff);
    iVar10 = 1;
    if (-1 < iVar17) goto LAB_001f9743;
    break;
  case 0x10:
    if (0 < (int)local_58) {
      puVar11 = (uchar *)calloc(local_58 & 0xffffffff,1);
      h->antiBools = puVar11;
      goto LAB_001f965d;
    }
  default:
switchD_001f943b_default:
    puVar11 = header_bytes(a,local_68);
    iVar10 = 1;
    if (puVar11 == (uchar *)0x0) break;
    goto LAB_001f9743;
  case 0x11:
    puVar11 = header_bytes(a,1);
    iVar10 = 1;
    uVar13 = local_40;
    if (((puVar11 != (uchar *)0x0) && (uVar16 = uVar16 - 1, (uVar16 & 1) == 0)) &&
       (local_60->numFolders << 2 <= uVar16)) {
      local_48 = (uchar *)malloc(uVar16);
      si[1].ss.unpack_streams = (size_t)local_48;
      uVar7 = uVar16;
      uVar13 = local_40;
      puVar11 = local_48;
      while (local_40 = uVar7, puVar11 != (uchar *)0x0) {
        if (local_40 == 0) {
          uVar7 = local_60->numFolders;
          local_40 = uVar13;
          if (uVar7 != 0) {
            p_Var14 = (_7z_coder *)si[1].ss.unpack_streams;
            uVar13 = 0;
            goto LAB_001f976f;
          }
          bVar19 = true;
          goto LAB_001f97cb;
        }
        rbytes = 0x10000;
        if (local_40 < 0x10000) {
          rbytes = local_40;
        }
        puVar11 = header_bytes(a,rbytes);
        uVar7 = local_40;
        uVar13 = local_40;
        if (puVar11 != (uchar *)0x0) {
          local_38 = puVar11;
          memcpy(local_48,puVar11,rbytes);
          local_48 = local_48 + rbytes;
          uVar7 = local_40 - rbytes;
          uVar13 = local_40;
          puVar11 = local_38;
        }
      }
    }
    local_40 = uVar13;
    bVar19 = false;
    goto LAB_001f95ab;
  case 0x12:
  case 0x13:
  case 0x14:
    iVar17 = read_Times(a,h,(uint)bVar2);
    iVar10 = 1;
    if (iVar17 < 0) break;
    goto LAB_001f9743;
  case 0x15:
    puVar11 = header_bytes(a,2);
    iVar10 = 1;
    if (puVar11 == (uchar *)0x0) {
      bVar19 = false;
    }
    else {
      uVar3 = *puVar11;
      sVar5 = local_60->numFolders;
      puVar11 = (uchar *)calloc(sVar5,1);
      h->attrBools = puVar11;
      if (puVar11 == (uchar *)0x0) {
LAB_001f973a:
        iVar10 = 1;
        bVar19 = false;
      }
      else {
        if (uVar3 == '\0') {
          iVar10 = read_Bools(a,puVar11,sVar5);
          if (iVar10 < 0) goto LAB_001f973a;
        }
        else {
          memset(puVar11,1,sVar5);
        }
        iVar10 = 6;
        bVar19 = true;
        if (local_60->numFolders != 0) {
          uVar16 = 0;
          uVar13 = 1;
          do {
            if (h->attrBools[uVar16] != '\0') {
              puVar11 = header_bytes(a,4);
              if (puVar11 == (uchar *)0x0) goto LAB_001f973a;
              *(undefined4 *)((long)&local_50->numUnpackStreams + uVar16 * 0x58 + 4) =
                   *(undefined4 *)puVar11;
            }
            bVar19 = uVar13 < local_60->numFolders;
            uVar16 = uVar13;
            uVar13 = (ulong)((int)uVar13 + 1);
          } while (bVar19);
          bVar19 = true;
          iVar10 = 6;
        }
      }
    }
    if (bVar19) goto LAB_001f9743;
  }
  goto LAB_001f9746;
  while( true ) {
    (&local_50->numCoders)[uVar13 * 0xb] = (long)p_Var8 - (long)p_Var14;
    p_Var14 = (_7z_coder *)((long)&p_Var8->codec + 2);
    uVar16 = uVar16 - 2;
    uVar13 = (ulong)((int)uVar13 + 1);
    if (uVar7 <= uVar13) break;
LAB_001f976f:
    (&local_50->coders)[uVar13 * 0xb] = p_Var14;
    for (p_Var8 = p_Var14;
        (1 < uVar16 &&
        (((char)p_Var8->codec != '\0' || (*(undefined1 *)((long)&p_Var8->codec + 1) != '\0'))));
        p_Var8 = (_7z_coder *)((long)&p_Var8->codec + 2)) {
      uVar16 = uVar16 - 2;
    }
    bVar19 = uVar16 >= 2;
    if (uVar16 < 2) goto LAB_001f95ab;
  }
LAB_001f97cb:
  iVar10 = 6;
LAB_001f95ab:
  if (bVar19) {
LAB_001f9743:
    iVar10 = 0;
  }
LAB_001f9746:
  if (iVar10 != 0) goto LAB_001f97d6;
  goto LAB_001f93d5;
LAB_001f97d6:
  if (iVar10 != 4) {
    return -1;
  }
  if (si[1].ci.numFolders == 0) {
    return 0;
  }
  p_Var6 = (si->ci).folders;
  uVar13 = 0;
  iVar10 = 0;
  iVar17 = 0;
  uVar9 = 0;
  uVar16 = 0;
  do {
    if ((h->emptyStreamBools == (uchar *)0x0) || (h->emptyStreamBools[uVar13] == '\0')) {
      *(byte *)(&local_50->bindPairs + uVar13 * 0xb) =
           *(byte *)(&local_50->bindPairs + uVar13 * 0xb) | 0x10;
    }
    puVar1 = &local_50->numCoders + uVar13 * 0xb;
    uVar15 = *(uint *)(&local_50->bindPairs + uVar13 * 0xb);
    uVar4 = *(uint *)((long)&local_50->numUnpackStreams + uVar13 * 0x58 + 4);
    *(uint *)(&local_50->numUnpackStreams + uVar13 * 0xb) = uVar4 >> 0x10;
    if ((uVar15 & 0x10) == 0) {
      if (h->emptyFileBools == (uchar *)0x0) {
        bVar19 = false;
      }
      else {
        bVar19 = h->emptyFileBools[iVar17] != '\0';
        iVar17 = iVar17 + 1;
      }
      if (uVar4 < 0x10000) {
        uVar15 = 0x41ff;
        if (bVar19) {
          uVar15 = 0x81b6;
        }
LAB_001f98e4:
        *(uint *)(puVar1 + 10) = uVar15;
      }
      else if ((uVar4 & 0xf0000000) != 0x40000000 && !bVar19) {
        uVar15 = uVar4 >> 0x10 & 0xfff | 0x4000;
        goto LAB_001f98e4;
      }
      if ((((puVar1[10] & 0xf000) == 0x4000) && (uVar7 = *puVar1, 1 < uVar7)) &&
         ((p_Var14 = (_7z_coder *)puVar1[1], *(char *)((long)p_Var14 + (uVar7 - 2)) != '/' ||
          (*(char *)((long)p_Var14 + (uVar7 - 1)) != '\0')))) {
        *(undefined1 *)((long)&p_Var14->codec + uVar7) = 0x2f;
        *(undefined1 *)((long)&((_7z_coder *)puVar1[1])->codec + *puVar1 + 1) = 0;
        *puVar1 = *puVar1 + 2;
      }
      *(undefined4 *)((long)puVar1 + 0x14) = 0xffffffff;
    }
    else {
      if ((si->ss).unpack_streams <= (ulong)(long)iVar10) {
        return -1;
      }
      if (uVar4 < 0x10000) {
        *(undefined4 *)(puVar1 + 10) = 0x81b6;
      }
      if ((si->ss).digestsDefined[iVar10] != '\0') {
        *(uint *)(puVar1 + 3) = uVar15 | 8;
      }
      *(int *)((long)puVar1 + 0x14) = iVar10;
      iVar10 = iVar10 + 1;
    }
    if ((*(byte *)((long)puVar1 + 0x54) & 1) != 0) {
      *(byte *)(puVar1 + 10) = (byte)puVar1[10] & 0x6d;
    }
    if (((ulong)puVar1[3] & 0x10) == 0 && uVar9 == 0) {
      *(undefined4 *)(puVar1 + 2) = 0xffffffff;
      uVar9 = 0;
    }
    else {
      if (uVar9 == 0) {
        while( true ) {
          if ((si->ci).numFolders <= uVar16) {
            return -1;
          }
          if (p_Var6[uVar16].numUnpackStreams != 0) break;
          uVar16 = (ulong)((int)uVar16 + 1);
        }
      }
      *(int *)(puVar1 + 2) = (int)uVar16;
      if (((ulong)puVar1[3] & 0x10) != 0) {
        uVar9 = uVar9 + 1;
        uVar18 = (ulong)uVar9;
        uVar7 = p_Var6[uVar16].numUnpackStreams;
        if (uVar7 <= uVar18) {
          uVar9 = 0;
        }
        uVar16 = (ulong)((uint)(uVar7 <= uVar18) + (int)uVar16);
      }
    }
    uVar13 = (ulong)((int)uVar13 + 1);
    if (local_60->numFolders <= uVar13) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
read_Header(struct archive_read *a, struct _7z_header_info *h,
    int check_header_id)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7z_folder *folders;
	struct _7z_stream_info *si = &(zip->si);
	struct _7zip_entry *entries;
	uint32_t folderIndex, indexInFolder;
	unsigned i;
	int eindex, empty_streams, sindex;

	if (check_header_id) {
		/*
		 * Read Header.
		 */
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		if (*p != kHeader)
			return (-1);
	}

	/*
	 * Read ArchiveProperties.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kArchiveProperties) {
		for (;;) {
			uint64_t size;
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			if (*p == 0)
				break;
			if (parse_7zip_uint64(a, &size) < 0)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 * Read MainStreamsInfo.
	 */
	if (*p == kMainStreamsInfo) {
		if (read_StreamsInfo(a, &(zip->si)) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kEnd)
		return (0);

	/*
	 * Read FilesInfo.
	 */
	if (*p != kFilesInfo)
		return (-1);

	if (parse_7zip_uint64(a, &(zip->numFiles)) < 0)
		return (-1);
	if (1000000 < zip->numFiles)
			return (-1);

	zip->entries = calloc((size_t)zip->numFiles, sizeof(*zip->entries));
	if (zip->entries == NULL)
		return (-1);
	entries = zip->entries;

	empty_streams = 0;
	for (;;) {
		int type;
		uint64_t size;
		size_t ll;

		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		type = *p;
		if (type == kEnd)
			break;

		if (parse_7zip_uint64(a, &size) < 0)
			return (-1);
		if (zip->header_bytes_remaining < size)
			return (-1);
		ll = (size_t)size;

		switch (type) {
		case kEmptyStream:
			h->emptyStreamBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->emptyStreamBools));
			if (h->emptyStreamBools == NULL)
				return (-1);
			if (read_Bools(
			    a, h->emptyStreamBools, (size_t)zip->numFiles) < 0)
				return (-1);
			empty_streams = 0;
			for (i = 0; i < zip->numFiles; i++) {
				if (h->emptyStreamBools[i])
					empty_streams++;
			}
			break;
		case kEmptyFile:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			h->emptyFileBools = calloc(empty_streams,
			    sizeof(*h->emptyFileBools));
			if (h->emptyFileBools == NULL)
				return (-1);
			if (read_Bools(a, h->emptyFileBools, empty_streams) < 0)
				return (-1);
			break;
		case kAnti:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			h->antiBools = calloc(empty_streams,
			    sizeof(*h->antiBools));
			if (h->antiBools == NULL)
				return (-1);
			if (read_Bools(a, h->antiBools, empty_streams) < 0)
				return (-1);
			break;
		case kCTime:
		case kATime:
		case kMTime:
			if (read_Times(a, h, type) < 0)
				return (-1);
			break;
		case kName:
		{
			unsigned char *np;
			size_t nl, nb;

			/* Skip one byte. */
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			ll--;

			if ((ll & 1) || ll < zip->numFiles * 4)
				return (-1);

			zip->entry_names = malloc(ll);
			if (zip->entry_names == NULL)
				return (-1);
			np = zip->entry_names;
			nb = ll;
			/*
			 * Copy whole file names.
			 * NOTE: This loop prevents from expanding
			 * the uncompressed buffer in order not to
			 * use extra memory resource.
			 */
			while (nb) {
				size_t b;
				if (nb > UBUFF_SIZE)
					b = UBUFF_SIZE;
				else
					b = nb;
				if ((p = header_bytes(a, b)) == NULL)
					return (-1);
				memcpy(np, p, b);
				np += b;
				nb -= b;
			}
			np = zip->entry_names;
			nl = ll;

			for (i = 0; i < zip->numFiles; i++) {
				entries[i].utf16name = np;
#if defined(_WIN32) && !defined(__CYGWIN__) && defined(_DEBUG)
				entries[i].wname = (wchar_t *)np;
#endif

				/* Find a terminator. */
				while (nl >= 2 && (np[0] || np[1])) {
					np += 2;
					nl -= 2;
				}
				if (nl < 2)
					return (-1);/* Terminator not found */
				entries[i].name_len = np - entries[i].utf16name;
				np += 2;
				nl -= 2;
			}
			break;
		}
		case kAttributes:
		{
			int allAreDefined;

			if ((p = header_bytes(a, 2)) == NULL)
				return (-1);
			allAreDefined = *p;
			h->attrBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->attrBools));
			if (h->attrBools == NULL)
				return (-1);
			if (allAreDefined)
				memset(h->attrBools, 1, (size_t)zip->numFiles);
			else {
				if (read_Bools(a, h->attrBools,
				      (size_t)zip->numFiles) < 0)
					return (-1);
			}
			for (i = 0; i < zip->numFiles; i++) {
				if (h->attrBools[i]) {
					if ((p = header_bytes(a, 4)) == NULL)
						return (-1);
					entries[i].attr = archive_le32dec(p);
				}
			}
			break;
		}
		default:
			if (header_bytes(a, ll) == NULL)
				return (-1);
			break;
		}
	}

	/*
	 * Set up entry's attributes.
	 */
	folders = si->ci.folders;
	eindex = sindex = 0;
	folderIndex = indexInFolder = 0;
	for (i = 0; i < zip->numFiles; i++) {
		if (h->emptyStreamBools == NULL || h->emptyStreamBools[i] == 0)
			entries[i].flg |= HAS_STREAM;
		/* The high 16 bits of attributes is a posix file mode. */
		entries[i].mode = entries[i].attr >> 16;
		if (entries[i].flg & HAS_STREAM) {
			if ((size_t)sindex >= si->ss.unpack_streams)
				return (-1);
			if (entries[i].mode == 0)
				entries[i].mode = AE_IFREG | 0666;
			if (si->ss.digestsDefined[sindex])
				entries[i].flg |= CRC32_IS_SET;
			entries[i].ssIndex = sindex;
			sindex++;
		} else {
			int dir;
			if (h->emptyFileBools == NULL)
				dir = 1;
			else {
				if (h->emptyFileBools[eindex])
					dir = 0;
				else
					dir = 1;
				eindex++;
			}
			if (entries[i].mode == 0) {
				if (dir)
					entries[i].mode = AE_IFDIR | 0777;
				else
					entries[i].mode = AE_IFREG | 0666;
			} else if (dir &&
			    (entries[i].mode & AE_IFMT) != AE_IFDIR) {
				entries[i].mode &= ~AE_IFMT;
				entries[i].mode |= AE_IFDIR;
			}
			if ((entries[i].mode & AE_IFMT) == AE_IFDIR &&
			    entries[i].name_len >= 2 &&
			    (entries[i].utf16name[entries[i].name_len-2] != '/' ||
			     entries[i].utf16name[entries[i].name_len-1] != 0)) {
				entries[i].utf16name[entries[i].name_len] = '/';
				entries[i].utf16name[entries[i].name_len+1] = 0;
				entries[i].name_len += 2;
			}
			entries[i].ssIndex = -1;
		}
		if (entries[i].attr & 0x01)
			entries[i].mode &= ~0222;/* Read only. */

		if ((entries[i].flg & HAS_STREAM) == 0 && indexInFolder == 0) {
			/*
			 * The entry is an empty file or a directory file,
			 * those both have no contents.
			 */
			entries[i].folderIndex = -1;
			continue;
		}
		if (indexInFolder == 0) {
			for (;;) {
				if (folderIndex >= si->ci.numFolders)
					return (-1);
				if (folders[folderIndex].numUnpackStreams)
					break;
				folderIndex++;
			}
		}
		entries[i].folderIndex = folderIndex;
		if ((entries[i].flg & HAS_STREAM) == 0)
			continue;
		indexInFolder++;
		if (indexInFolder >= folders[folderIndex].numUnpackStreams) {
			folderIndex++;
			indexInFolder = 0;
		}
	}

	return (0);
}